

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O1

bool __thiscall Js::JavascriptSet::Has(JavascriptSet *this,Var value)

{
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  BOOLEAN BVar4;
  bool bVar5;
  bool bVar6;
  Var pvVar7;
  undefined4 *puVar8;
  Var local_48;
  Var simpleVar;
  Var local_38;
  Var value_local;
  
  pTVar2 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr
             )->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  local_38 = value;
  switch(this->kind) {
  case EmptySet:
    break;
  case IntSet:
    pvVar7 = JavascriptConversion::TryCanonicalizeAsTaggedInt<false,true>(value);
    if (pvVar7 != (Var)0x0) {
      if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        simpleVar = (Var)__tls_get_addr(&PTR_0155fe48);
        *(undefined4 *)simpleVar = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar6) goto LAB_00d1b7c3;
        *(undefined4 *)simpleVar = 0;
      }
      if (((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
        if (!bVar6) goto LAB_00d1b7c3;
        *puVar8 = 0;
      }
      BVar4 = BVSparse<Memory::Recycler>::Test
                        ((BVSparse<Memory::Recycler> *)this->u,(BVIndex)pvVar7);
      bVar6 = BVar4 != '\0';
      goto LAB_00d1b7ac;
    }
    break;
  case SimpleVarSet:
    bVar5 = JsUtil::
            BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           *)this->u,&local_38);
    bVar6 = true;
    if (!bVar5) {
      local_48 = JavascriptConversion::TryCanonicalizeAsSimpleVar<true>(local_38);
      bVar6 = false;
      if ((local_48 != (Var)0x0) && (local_48 != local_38)) {
        bVar6 = JsUtil::
                BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               *)this->u,&local_48);
      }
    }
    goto LAB_00d1b7ac;
  case ComplexVarSet:
    bVar6 = JsUtil::
            BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           *)this->u,&local_38);
    goto LAB_00d1b7ac;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x252,"((0))","(0)");
    if (!bVar6) {
LAB_00d1b7c3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  bVar6 = false;
LAB_00d1b7ac:
  pTVar2->noJsReentrancy = bVar1;
  return bVar6;
}

Assistant:

bool JavascriptSet::Has(Var value)
{
    JS_REENTRANCY_LOCK(jsReentLock, this->GetScriptContext()->GetThreadContext());
    switch (this->kind)
    {
    case SetKind::EmptySet:
        return false;

    case SetKind::IntSet:
    {
        Var taggedInt = JavascriptConversion::TryCanonicalizeAsTaggedInt<false /* allowNegOne */, true /* allowLossyConversion */ >(value);
        if (!taggedInt)
        {
            return false;
        }
        int32 intVal = TaggedInt::ToInt32(taggedInt);
        return this->u.intSet->Test(intVal);
    }

    case SetKind::SimpleVarSet:
    {
        // First check if the value is in the set
        if (this->u.simpleVarSet->ContainsKey(value))
        {
            return true;
        }
        // If the value isn't in the set, check if the canonical value is
        Var simpleVar = JavascriptConversion::TryCanonicalizeAsSimpleVar<true /* allowLossyConversion */>(value);
        // If the simple value is the same as the original value, we know it isn't in the set
        if (!simpleVar || simpleVar == value)
        {
            return false;
        }

        return this->u.simpleVarSet->ContainsKey(simpleVar);
    }

    case SetKind::ComplexVarSet:
        return this->u.complexVarSet->ContainsKey(value);

    default:
        Assume(UNREACHED);
        return false;
    }
}